

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

void __thiscall Noise::addNoise(Noise *this)

{
  undefined1 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int **pp_Var5;
  pointer ppBVar6;
  ParameterSet *pPVar7;
  DataManager *pDVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  value_handle vVar11;
  bool bVar12;
  int iVar13;
  BaseHandle BVar14;
  long lVar15;
  undefined4 extraout_var;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar16;
  reference pvVar17;
  undefined4 extraout_var_00;
  const_reference pvVar18;
  ulong uVar19;
  int number;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  EdgeIter EVar26;
  VertexIter VVar27;
  undefined1 local_308 [8];
  TriMesh mesh;
  double noise_level;
  double impulsive_level;
  undefined1 auStack_c8 [8];
  vector<double,_std::allocator<double>_> GaussianNumbers;
  int noise_type_index;
  int noise_direction_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  RandomDirections;
  undefined1 auStack_88 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  VertexListAndGaussianNumbers;
  undefined1 local_68 [8];
  VertexIter v_it;
  
  DataManager::getMesh((TriMesh *)local_308,this->data_manager_);
  uVar10 = mesh.super_Mesh.
           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           .
           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
           ._168_8_;
  uVar9 = mesh.super_Mesh.
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          ._160_8_;
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_308);
  if (uVar10 != uVar9) {
    pPVar7 = this->parameter_set_;
    puVar1 = &mesh.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .field_0x8;
    local_308 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Noise level","");
    bVar12 = ParameterSet::getValue
                       (pPVar7,(string *)local_308,
                        (double *)
                        &mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .refcount_fcolors_);
    if (local_308 != (undefined1  [8])puVar1) {
      operator_delete((void *)local_308);
    }
    if (bVar12) {
      pPVar7 = this->parameter_set_;
      local_308 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Impulsive level","");
      bVar12 = ParameterSet::getValue(pPVar7,(string *)local_308,&noise_level);
      if (local_308 != (undefined1  [8])puVar1) {
        operator_delete((void *)local_308);
      }
      if (bVar12) {
        pPVar7 = this->parameter_set_;
        local_308 = (undefined1  [8])puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Noise type","");
        bVar12 = ParameterSet::getValue
                           (pPVar7,(string *)local_308,
                            (int *)&GaussianNumbers.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
        if (local_308 != (undefined1  [8])puVar1) {
          operator_delete((void *)local_308);
        }
        if (bVar12) {
          pPVar7 = this->parameter_set_;
          local_308 = (undefined1  [8])puVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Noise direction","");
          bVar12 = ParameterSet::getValue
                             (pPVar7,(string *)local_308,
                              (int *)((long)&GaussianNumbers.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4))
          ;
          if (local_308 != (undefined1  [8])puVar1) {
            operator_delete((void *)local_308);
          }
          if (bVar12) {
            pDVar8 = this->data_manager_;
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)&pDVar8->mesh_,(PolyConnectivity *)pDVar8);
            memcpy(&(pDVar8->mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,
                   &(pDVar8->original_mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,0x84);
            impulsive_level = (double)this;
            DataManager::getMesh((TriMesh *)local_308,this->data_manager_);
            _noise_type_index =
                 OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)local_308);
            dVar23 = 0.0;
            while( true ) {
              EVar26 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)local_308);
              if (RandomDirections.
                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ ==
                  (BaseHandle)EVar26.hnd_.super_BaseHandle.idx_ && _noise_type_index == EVar26.mesh_
                 ) break;
              OpenMesh::
              PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              ::calc_edge_vector((Normal *)auStack_c8,
                                 (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  *)local_308,
                                 (HalfedgeHandle)
                                 ((int)RandomDirections.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_ * 2));
              dVar22 = (double)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish *
                       (double)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                       (double)auStack_c8 * (double)auStack_c8 +
                       (double)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start *
                       (double)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              if (dVar22 < 0.0) {
                v_it._8_8_ = sqrt(dVar22);
              }
              else {
                v_it._8_8_ = SQRT(dVar22);
              }
              RandomDirections.
              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (BaseHandle)
                   (BaseHandle)
                   ((int)RandomDirections.
                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_ + 1);
              if (RandomDirections.
                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ != 0) {
                OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)&noise_type_index);
              }
              dVar23 = dVar23 + (double)v_it._8_8_;
            }
            lVar15 = (long)(mesh.super_Mesh.
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            ._192_8_ -
                           mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._184_8_) >> 5;
            auVar24._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._192_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._184_8_) >> 0x25);
            auVar24._0_8_ = lVar15;
            auVar24._12_4_ = 0x45300000;
            dVar22 = (dVar23 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0))) *
                     (double)mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._544_8_;
            lVar15 = (long)(mesh.super_Mesh.
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            ._168_8_ -
                           mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._160_8_) >> 2;
            auVar25._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._168_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._160_8_) >> 0x22);
            auVar25._0_8_ = lVar15;
            auVar25._12_4_ = 0x45300000;
            v_it._8_8_ = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) *
                         noise_level;
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_face_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_308);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_vertex_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_308);
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::update_normals((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              *)local_308);
            dVar23 = impulsive_level;
            auStack_c8 = (undefined1  [8])0x0;
            GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            RandomDirections.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _noise_type_index = (EdgeIter)ZEXT816(0);
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auStack_88 = (undefined1  [8])0x0;
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            iVar13 = (int)((ulong)(mesh.super_Mesh.
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   ._168_8_ -
                                  mesh.super_Mesh.
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  ._160_8_) >> 2);
            if ((int)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0) {
              randomGaussianNumbers
                        ((Noise *)impulsive_level,0.0,dVar22,iVar13,
                         (vector<double,_std::allocator<double>_> *)auStack_c8);
              if (GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                _local_68 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_308);
                while( true ) {
                  VVar27 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_308);
                  vVar11.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  if (v_it.mesh_._0_4_ == (BaseHandle)VVar27.hnd_.super_BaseHandle.idx_ &&
                      local_68 == (undefined1  [8])VVar27.mesh_) break;
                  pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar16,(int)vVar11.super_BaseHandle.idx_);
                  vVar11.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._416_4_);
                  pvVar18 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar16,(int)vVar11.super_BaseHandle.idx_);
                  vVar11.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  dVar23 = *(double *)((long)auStack_c8 + (long)(int)v_it.mesh_._0_4_ * 8);
                  dVar22 = (pvVar18->super_VectorDataT<double,_3>).values_[0];
                  dVar2 = (pvVar18->super_VectorDataT<double,_3>).values_[2];
                  dVar3 = (pvVar17->super_VectorDataT<double,_3>).values_[0];
                  v_it._8_8_ = (pvVar18->super_VectorDataT<double,_3>).values_[1] * dVar23 +
                               (pvVar17->super_VectorDataT<double,_3>).values_[1];
                  dVar4 = (pvVar17->super_VectorDataT<double,_3>).values_[2];
                  pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar16,(int)vVar11.super_BaseHandle.idx_);
                  (pvVar17->super_VectorDataT<double,_3>).values_[0] = dVar22 * dVar23 + dVar3;
                  (pvVar17->super_VectorDataT<double,_3>).values_[1] = (double)v_it._8_8_;
                  (pvVar17->super_VectorDataT<double,_3>).values_[2] = dVar23 * dVar2 + dVar4;
                  v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
                  if (v_it.mesh_._4_4_ != 0) {
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_68);
                  }
                }
              }
              else {
                randomDirections((Noise *)dVar23,
                                 (int)((ulong)(mesh.super_Mesh.
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                               ._168_8_ -
                                              mesh.super_Mesh.
                                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                              .
                                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                              ._160_8_) >> 2),
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&noise_type_index);
                _local_68 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_308);
                while( true ) {
                  VVar27 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_308);
                  vVar11.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  if (v_it.mesh_._0_4_ == (BaseHandle)VVar27.hnd_.super_BaseHandle.idx_ &&
                      local_68 == (undefined1  [8])VVar27.mesh_) break;
                  lVar15 = (long)(int)v_it.mesh_._0_4_;
                  pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar16,(int)vVar11.super_BaseHandle.idx_);
                  dVar23 = *(double *)((long)auStack_c8 + lVar15 * 8);
                  pp_Var5 = (&(_noise_type_index->super_ArrayKernel).super_BaseKernel.
                              _vptr_BaseKernel)[lVar15 * 3];
                  ppBVar6 = (&(_noise_type_index->super_ArrayKernel).super_BaseKernel.vprops_.
                              properties_)[lVar15].
                            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar22 = (pvVar17->super_VectorDataT<double,_3>).values_[0];
                  v_it._8_8_ = (double)(&(_noise_type_index->super_ArrayKernel).super_BaseKernel.
                                         vprops_._vptr_PropertyContainer)[lVar15 * 3] * dVar23 +
                               (pvVar17->super_VectorDataT<double,_3>).values_[1];
                  dVar2 = (pvVar17->super_VectorDataT<double,_3>).values_[2];
                  vVar11.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar16,(int)vVar11.super_BaseHandle.idx_);
                  (pvVar17->super_VectorDataT<double,_3>).values_[0] =
                       (double)pp_Var5 * dVar23 + dVar22;
                  (pvVar17->super_VectorDataT<double,_3>).values_[1] = (double)v_it._8_8_;
                  (pvVar17->super_VectorDataT<double,_3>).values_[2] =
                       dVar23 * (double)ppBVar6 + dVar2;
                  v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
                  if (v_it.mesh_._4_4_ != 0) {
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_68);
                  }
                }
              }
            }
            else {
              number = (int)(double)v_it._8_8_;
              randomImpulsiveNumbers
                        ((Noise *)impulsive_level,0,iVar13 + -1,number,0.0,dVar22,
                         (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )auStack_88);
              if (GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                if (0 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_88) >> 4)) {
                  lVar20 = 0;
                  lVar15 = 0;
                  do {
                    uVar19 = (ulong)*(uint *)((long)(int *)auStack_88 + lVar20);
                    iVar13 = (**(_func_int **)((long)local_308 + 0x10))(local_308);
                    BVar14.idx_ = -1;
                    if (uVar19 < CONCAT44(extraout_var_00,iVar13)) {
                      BVar14.idx_ = (int)OpenMesh::ArrayKernel::handle
                                                   ((ArrayKernel *)local_308,
                                                    (Vertex *)
                                                    (uVar19 * 4 +
                                                    mesh.super_Mesh.
                                                                                                        
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_));
                    }
                    pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar16,BVar14.idx_);
                    pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._416_4_);
                    pvVar18 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar16,BVar14.idx_);
                    dVar23 = *(double *)((long)((long)auStack_88 + 8) + lVar20);
                    dVar22 = (pvVar18->super_VectorDataT<double,_3>).values_[0];
                    dVar2 = (pvVar18->super_VectorDataT<double,_3>).values_[2];
                    dVar3 = (pvVar17->super_VectorDataT<double,_3>).values_[0];
                    v_it._8_8_ = (pvVar18->super_VectorDataT<double,_3>).values_[1] * dVar23 +
                                 (pvVar17->super_VectorDataT<double,_3>).values_[1];
                    dVar4 = (pvVar17->super_VectorDataT<double,_3>).values_[2];
                    pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar16,BVar14.idx_);
                    (pvVar17->super_VectorDataT<double,_3>).values_[0] = dVar22 * dVar23 + dVar3;
                    (pvVar17->super_VectorDataT<double,_3>).values_[1] = (double)v_it._8_8_;
                    (pvVar17->super_VectorDataT<double,_3>).values_[2] = dVar23 * dVar2 + dVar4;
                    lVar15 = lVar15 + 1;
                    lVar20 = lVar20 + 0x10;
                  } while (lVar15 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                 (long)auStack_88) >> 4));
                }
              }
              else {
                randomDirections((Noise *)dVar23,number,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&noise_type_index);
                if (0 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_88) >> 4)) {
                  lVar21 = 0x10;
                  lVar20 = 0;
                  lVar15 = 0;
                  do {
                    uVar19 = (ulong)*(uint *)((long)(int *)auStack_88 + lVar20);
                    iVar13 = (**(_func_int **)((long)local_308 + 0x10))(local_308);
                    BVar14.idx_ = -1;
                    if (uVar19 < CONCAT44(extraout_var,iVar13)) {
                      BVar14.idx_ = (int)OpenMesh::ArrayKernel::handle
                                                   ((ArrayKernel *)local_308,
                                                    (Vertex *)
                                                    (uVar19 * 4 +
                                                    mesh.super_Mesh.
                                                                                                        
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_));
                    }
                    pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar16,BVar14.idx_);
                    dVar23 = *(double *)((long)((long)auStack_88 + 8) + lVar20);
                    dVar22 = *(double *)((long)_noise_type_index + lVar21 + -0x10);
                    dVar2 = *(double *)
                             ((long)&(_noise_type_index->super_ArrayKernel).super_BaseKernel.
                                     _vptr_BaseKernel + lVar21);
                    dVar3 = (pvVar17->super_VectorDataT<double,_3>).values_[0];
                    v_it._8_8_ = *(double *)((long)_noise_type_index + lVar21 + -8) * dVar23 +
                                 (pvVar17->super_VectorDataT<double,_3>).values_[1];
                    dVar4 = (pvVar17->super_VectorDataT<double,_3>).values_[2];
                    pPVar16 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar17 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar16,BVar14.idx_);
                    (pvVar17->super_VectorDataT<double,_3>).values_[0] = dVar22 * dVar23 + dVar3;
                    (pvVar17->super_VectorDataT<double,_3>).values_[1] = (double)v_it._8_8_;
                    (pvVar17->super_VectorDataT<double,_3>).values_[2] = dVar23 * dVar2 + dVar4;
                    lVar15 = lVar15 + 1;
                    lVar20 = lVar20 + 0x10;
                    lVar21 = lVar21 + 0x18;
                  } while (lVar15 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                 (long)auStack_88) >> 4));
                }
              }
            }
            dVar23 = impulsive_level;
            lVar15 = *(long *)((long)impulsive_level + 8);
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)(lVar15 + 0x678),(PolyConnectivity *)local_308);
            puVar1 = &mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      .field_0x19c;
            memcpy((void *)(lVar15 + 0x81c),puVar1,0x84);
            lVar15 = *(long *)((long)dVar23 + 8);
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)(lVar15 + 0x228),(PolyConnectivity *)local_308);
            memcpy((void *)(lVar15 + 0x3cc),puVar1,0x84);
            lVar15 = *(long *)((long)dVar23 + 8);
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)(lVar15 + 0x450),(PolyConnectivity *)local_308);
            memcpy((void *)(lVar15 + 0x5f4),puVar1,0x84);
            if (auStack_88 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_88);
            }
            if (_noise_type_index != (mesh_ptr)0x0) {
              operator_delete(_noise_type_index);
            }
            if (auStack_c8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_c8);
            }
            OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_308);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Noise::addNoise()
{
    if(data_manager_->getMesh().n_vertices() == 0)
        return;

    // get parameters
    double noise_level, impulsive_level;
    if(!parameter_set_->getValue(string("Noise level"), noise_level))
        return;
    if(!parameter_set_->getValue(string("Impulsive level"), impulsive_level))
        return;

    int noise_type_index, noise_direction_index;
    if(!parameter_set_->getValue(string("Noise type"), noise_type_index))
        return;
    if(!parameter_set_->getValue(string("Noise direction"), noise_direction_index))
        return;

    data_manager_->MeshToOriginalMesh();

    NoiseType noise_type = (noise_type_index == 0)? kGaussian : kImpulsive;
    NoiseDirection noise_direction = (noise_direction_index == 0)? kNormal : kRandom;

    // compute average length of mesh
    double average_length = 0.0;
    TriMesh mesh = data_manager_->getMesh();
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_length += mesh.calc_edge_length(*e_it);
    double edge_numbers = (double)mesh.n_edges();
    average_length /= edge_numbers;

    // add noise
    double standard_derivation = average_length * noise_level;
    int impulsive_vertex_number = (int)(mesh.n_vertices() * impulsive_level);

    mesh.request_face_normals();
    mesh.request_vertex_normals();
    mesh.update_normals();

    std::vector<double> GaussianNumbers;
    std::vector<TriMesh::Normal> RandomDirections;
    std::vector<std::pair<int, double> > VertexListAndGaussianNumbers;

    if(noise_type == kGaussian){
        randomGaussianNumbers(0, standard_derivation, (int)mesh.n_vertices(), GaussianNumbers);
        if(noise_direction == kNormal){
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){

                TriMesh::Point p = mesh.point(*v_it) + mesh.normal(*v_it) * GaussianNumbers[v_it->idx()];
                mesh.set_point(*v_it, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections((int)mesh.n_vertices(), RandomDirections);
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){
                int index = v_it->idx();
                TriMesh::Point p = mesh.point(*v_it) + RandomDirections[index] * GaussianNumbers[index];
                mesh.set_point(*v_it, p);
            }
        }
    }
    else if(noise_type == kImpulsive){
        randomImpulsiveNumbers(0,(int)mesh.n_vertices() - 1, impulsive_vertex_number, 0, standard_derivation, VertexListAndGaussianNumbers);
        if(noise_direction == kNormal){
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + mesh.normal(vh) * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections(impulsive_vertex_number, RandomDirections);
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + RandomDirections[i] * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
    }

    data_manager_->setMesh(mesh);
    data_manager_->setNoisyMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}